

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
::
emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&&>,std::tuple<phmap::priv::NonStandardLayout&&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
          *this,int *key,size_t hashval,piecewise_construct_t *args,tuple<const_int_&&> *args_1,
          tuple<phmap::priv::NonStandardLayout_&&> *args_2)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this_00;
  string *psVar1;
  long lVar2;
  NonStandardLayout *pNVar3;
  pointer pcVar4;
  size_t sVar5;
  size_t sVar6;
  ctrl_t *pcVar7;
  slot_type *psVar8;
  ctrl_t *pcVar9;
  
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             *)(this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)hashval >> 0x10 ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) *
                       0x48);
  sVar5 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
          ::_find_key<int>(this_00,key,hashval);
  if (sVar5 == 0xffffffffffffffff) {
    sVar6 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
            ::prepare_insert(this_00,hashval);
    psVar8 = this_00->slots_;
    pNVar3 = (args_2->super__Tuple_impl<0UL,_phmap::priv::NonStandardLayout_&&>).
             super__Head_base<0UL,_phmap::priv::NonStandardLayout_&&,_false>._M_head_impl;
    psVar1 = (string *)((long)psVar8 + sVar6 * 0x30 + 0x10);
    *(int *)(psVar1 + -0x10) =
         *(args_1->super__Tuple_impl<0UL,_const_int_&&>).super__Head_base<0UL,_const_int_&&,_false>.
          _M_head_impl;
    *(undefined ***)(psVar1 + -8) = &PTR__NonStandardLayout_0034a128;
    lVar2 = (long)psVar8 + sVar6 * 0x30 + 0x20;
    *(long *)(lVar2 + -0x10) = lVar2;
    pcVar4 = (pNVar3->value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (psVar1,pcVar4,pcVar4 + (pNVar3->value)._M_string_length);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
    ::set_ctrl(this_00,sVar6,(byte)hashval & 0x7f);
    pcVar7 = this_00->ctrl_;
    pcVar9 = pcVar7 + sVar6;
    psVar8 = this_00->slots_ + sVar6;
  }
  else {
    pcVar7 = this_00->ctrl_;
    pcVar9 = pcVar7 + sVar5;
    psVar8 = this_00->slots_ + sVar5;
  }
  sVar6 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x480);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar9;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar8;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar7 + sVar6;
  __return_storage_ptr__->second = sVar5 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }